

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O3

string * __thiscall Assimp::Ogre::OgreXmlSerializer::NextNode_abi_cxx11_(OgreXmlSerializer *this)

{
  int iVar1;
  string local_30;
  
  do {
    iVar1 = (*this->m_reader->_vptr_IIrrXMLReader[2])();
    if ((char)iVar1 == '\0') {
      std::__cxx11::string::_M_replace
                ((ulong)&this->m_currentNodeName,0,
                 (char *)(this->m_currentNodeName)._M_string_length,0x6a8b41);
      goto LAB_00422c7c;
    }
    iVar1 = (*this->m_reader->_vptr_IIrrXMLReader[3])();
  } while (iVar1 != 1);
  CurrentNodeName_abi_cxx11_(&local_30,this,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
LAB_00422c7c:
  return &this->m_currentNodeName;
}

Assistant:

std::string &OgreXmlSerializer::NextNode()
{
    do
    {
        if (!m_reader->read())
        {
            m_currentNodeName = "";
            return m_currentNodeName;
        }
    }
    while(m_reader->getNodeType() != irr::io::EXN_ELEMENT);

    CurrentNodeName(true);
#if (OGRE_XML_SERIALIZER_DEBUG == 1)
    ASSIMP_LOG_DEBUG"<" + m_currentNodeName + ">");
#endif
    return m_currentNodeName;
}